

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          V *values,int num_keys)

{
  int iVar1;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  int in_EDX;
  int *in_RSI;
  long *in_RDI;
  double dVar2;
  DataNodeStats stats;
  LinearModel<int> root_data_node_model;
  int max_key;
  int min_key;
  DataNodeStats *in_stack_00000048;
  double in_stack_00000068;
  int in_stack_00000074;
  V *in_stack_00000078;
  LinearModel<int> *in_stack_00000150;
  int in_stack_0000015c;
  AlexNode<int,_int> **in_stack_00000160;
  int in_stack_0000016c;
  V *in_stack_00000170;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_stack_00000178;
  void *in_stack_ffffffffffffffa0;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffffb0;
  double local_48;
  LinearModel<int> local_40;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffffe0;
  int local_14;
  int *local_10;
  
  if (((int)in_RDI[5] < 1) && (0 < in_EDX)) {
    local_14 = in_EDX;
    local_10 = in_RSI;
    delete_node(in_stack_ffffffffffffffe0,
                (AlexNode<int,_int> *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
    ;
    *(int *)(in_RDI + 5) = local_14;
    model_node_allocator
              ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
               &stack0xffffffffffffffeb);
    this_00 = (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
              __gnu_cxx::
              new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
              allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_ffffffffffffffb0,(size_type)in_RDI,in_stack_ffffffffffffffa0);
    AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
              (in_stack_ffffffffffffffb0,(short)((ulong)in_RDI >> 0x30),
               (allocator<std::pair<int,_int>_> *)this_00);
    *in_RDI = (long)this_00;
    std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
    ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *)
               0x1033bf);
    iVar1 = *local_10;
    iVar3 = local_10[(long)(local_14 + -1) * 2];
    *(double *)(*in_RDI + 0x10) = 1.0 / (double)(iVar3 - iVar1);
    *(double *)(*in_RDI + 0x18) = (double)iVar1 * -1.0 * *(double *)(*in_RDI + 0x10);
    LinearModel<int>::LinearModel(&local_40);
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
    build_model((V *)root_data_node_model.b_,root_data_node_model.a_._4_4_,
                (LinearModel<int> *)stats.num_shifts,stats.num_search_iterations._7_1_);
    DataNodeStats::DataNodeStats((DataNodeStats *)&stack0xffffffffffffffb0);
    dVar2 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
            compute_expected_cost
                      (in_stack_00000078,in_stack_00000074,in_stack_00000068,(double)this,
                       (LinearModel<int> *)values,num_keys._3_1_,in_stack_00000048);
    *(double *)(*in_RDI + 0x20) = dVar2;
    bulk_load_node(in_stack_00000178,in_stack_00000170,in_stack_0000016c,in_stack_00000160,
                   in_stack_0000015c,in_stack_00000150);
    if ((*(byte *)(*in_RDI + 8) & 1) != 0) {
      *(AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> **)(*in_RDI + 0xb8) =
           in_stack_ffffffffffffffb0;
      *(double *)(*in_RDI + 0xc0) = local_48;
    }
    create_superroot((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                      *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
    update_superroot_key_domain(this_00);
    link_all_data_nodes((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                         *)stats.num_shifts);
  }
  return;
}

Assistant:

void bulk_load(const V values[], int num_keys) {
    if (stats_.num_keys > 0 || num_keys <= 0) {
      return;
    }
    delete_node(root_node_);  // delete the empty root node from constructor

    stats_.num_keys = num_keys;

    // Build temporary root model, which outputs a CDF in the range [0, 1]
    root_node_ =
        new (model_node_allocator().allocate(1)) model_node_type(0, allocator_);
    T min_key = values[0].first;
    T max_key = values[num_keys - 1].first;
    root_node_->model_.a_ = 1.0 / (max_key - min_key);
    root_node_->model_.b_ = -1.0 * min_key * root_node_->model_.a_;

    // Compute cost of root node
    LinearModel<T> root_data_node_model;
    data_node_type::build_model(values, num_keys, &root_data_node_model,
                                params_.approximate_model_computation);
    DataNodeStats stats;
    root_node_->cost_ = data_node_type::compute_expected_cost(
        values, num_keys, data_node_type::kInitDensity_,
        params_.expected_insert_frac, &root_data_node_model,
        params_.approximate_cost_computation, &stats);

    // Recursively bulk load
    bulk_load_node(values, num_keys, root_node_, num_keys,
                   &root_data_node_model);

    if (root_node_->is_leaf_) {
      static_cast<data_node_type*>(root_node_)
          ->expected_avg_exp_search_iterations_ = stats.num_search_iterations;
      static_cast<data_node_type*>(root_node_)->expected_avg_shifts_ =
          stats.num_shifts;
    }

    create_superroot();
    update_superroot_key_domain();
    link_all_data_nodes();
  }